

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

void __thiscall
helics::apps::Clone::captureForCurrentTime(Clone *this,Time currentTime,int iteration)

{
  int iVar1;
  pointer piVar2;
  Time TVar3;
  bool bVar4;
  mapped_type *pmVar5;
  string *psVar6;
  _Elt_pointer pIVar7;
  Endpoint *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar8;
  _Elt_pointer this_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Time currentTime_local;
  int subid;
  _Map_pointer local_f8;
  _Elt_pointer local_f0;
  undefined1 local_e8 [24];
  _Alloc_hider _Stack_d0;
  pointer local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  MessageFederate *pMStack_b0;
  string valstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string local_50;
  
  this_01 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar8 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_f8 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pIVar7 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  currentTime_local.internalTimeCode = currentTime.internalTimeCode;
  local_f0 = pIVar7;
  while (this_01 != pIVar7) {
    bVar4 = Input::isUpdated(this_01);
    if (bVar4) {
      Input::getValue_impl<std::__cxx11::string>(&val,this_01);
      local_e8._0_4_ = (this_01->super_Interface).handle.hid;
      pmVar5 = CLI::std::
               map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
               ::operator[](&this->subids,(key_type *)local_e8);
      subid = *pmVar5;
      std::
      vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>::
      emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                ((vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>
                  *)&this->points,&currentTime_local,&subid,&val);
      TVar3 = currentTime_local;
      if (0 < iteration) {
        (this->points).
        super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].iteration = (int16_t)iteration;
      }
      if (this->verbose == true) {
        valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
        valstr._M_string_length = 0;
        valstr.field_2._M_local_buf[0] = '\0';
        if (val._M_string_length < 0x96) {
          if (iteration < 1) {
            psVar6 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar3.internalTimeCode / 1000000000);
            local_e8._16_8_ = (psVar6->_M_dataplus)._M_p;
            _Stack_d0._M_p = (pointer)psVar6->_M_string_length;
            local_c8 = val._M_dataplus._M_p;
            aStack_c0._M_allocated_capacity = val._M_string_length;
            fmt_01.size_ = 0xdda;
            fmt_01.data_ = (char *)0xf;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)"[{}]value {}={}",fmt_01,args_01);
          }
          else {
            psVar6 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar3.internalTimeCode / 1000000000);
            local_e8._16_4_ = iteration;
            local_c8 = (psVar6->_M_dataplus)._M_p;
            aStack_c0._M_allocated_capacity = psVar6->_M_string_length;
            aStack_c0._8_8_ = val._M_dataplus._M_p;
            pMStack_b0 = (MessageFederate *)val._M_string_length;
            fmt.size_ = 0xdd1a;
            fmt.data_ = (char *)0x12;
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)"[{}:{}]value {}={}",fmt,args);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&valstr,
                     &local_50);
          std::__cxx11::string::~string((string *)&local_50);
          pIVar7 = local_f0;
        }
        else {
          if (iteration < 1) {
            psVar6 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar3.internalTimeCode / 1000000000);
            local_e8._16_8_ = (psVar6->_M_dataplus)._M_p;
            _Stack_d0._M_p = (pointer)psVar6->_M_string_length;
            local_c8 = (pointer)val._M_string_length;
            fmt_02.size_ = 0x4da;
            fmt_02.data_ = (char *)0x16;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02)
            ;
          }
          else {
            psVar6 = Input::getTarget_abi_cxx11_(this_01);
            local_e8._0_8_ =
                 (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
                 (double)(TVar3.internalTimeCode / 1000000000);
            local_e8._16_4_ = iteration;
            local_c8 = (psVar6->_M_dataplus)._M_p;
            aStack_c0._M_allocated_capacity = psVar6->_M_string_length;
            aStack_c0._8_8_ = val._M_string_length;
            fmt_00.size_ = 0x4d1a;
            fmt_00.data_ = (char *)0x19;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_e8;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_50,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&valstr,
                     &local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        spdlog::info<std::__cxx11::string>(&valstr);
        std::__cxx11::string::~string((string *)&valstr);
      }
      piVar2 = (this->pubPointCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar2[subid];
      if (iVar1 == 0) {
        (this->points).
        super__Vector_base<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first = true;
      }
      piVar2[subid] = iVar1 + 1;
      std::__cxx11::string::~string((string *)&val);
    }
    this_01 = this_01 + 1;
    if (this_01 == pIVar8) {
      this_01 = local_f8[1];
      local_f8 = local_f8 + 1;
      pIVar8 = this_01 + 1;
    }
  }
  this_00 = (this->cloneEndpoint)._M_t.
            super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
            super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
            super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
  if (this_00 != (Endpoint *)0x0) {
    while (bVar4 = Endpoint::hasMessage(this_00), bVar4) {
      Endpoint::getMessage((Endpoint *)local_e8);
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)&this->messages,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_e8);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_e8);
      this_00 = (this->cloneEndpoint)._M_t.
                super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t
                .super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
                super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    }
  }
  return;
}

Assistant:

void Clone::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subid = subids[sub.getHandle()];
            points.emplace_back(currentTime, subid, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (pubPointCount[subid] == 0) {
                points.back().first = true;
            }
            ++pubPointCount[subid];
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}